

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_v4dwt_interleave_partial_h
               (opj_v4dwt_t *dwt,opj_sparse_array_int32_t *sa,OPJ_UINT32 sa_line,
               OPJ_UINT32 remaining_height)

{
  OPJ_UINT32 y1;
  OPJ_BOOL OVar1;
  long lVar2;
  
  if (remaining_height != 0) {
    lVar2 = 0;
    do {
      y1 = sa_line + 1;
      OVar1 = opj_sparse_array_int32_read
                        (sa,dwt->win_l_x0,sa_line,dwt->win_l_x1,y1,
                         (OPJ_INT32 *)
                         ((long)dwt->wavelet +
                         (ulong)(dwt->win_l_x0 * 2) * 0x10 + lVar2 + (long)dwt->cas * 0x10),8,0,1);
      if (OVar1 == 0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                      ,0x8bf,
                      "void opj_v4dwt_interleave_partial_h(opj_v4dwt_t *, opj_sparse_array_int32_t *, OPJ_UINT32, OPJ_UINT32)"
                     );
      }
      OVar1 = opj_sparse_array_int32_read
                        (sa,dwt->win_h_x0 + dwt->sn,sa_line,dwt->sn + dwt->win_h_x1,y1,
                         (OPJ_INT32 *)
                         ((long)dwt->wavelet +
                         lVar2 + (ulong)(dwt->win_h_x0 * 2) * 0x10 + (long)dwt->cas * -0x10 + 0x10),
                         8,0,1);
      if (OVar1 == 0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                      ,0x8c6,
                      "void opj_v4dwt_interleave_partial_h(opj_v4dwt_t *, opj_sparse_array_int32_t *, OPJ_UINT32, OPJ_UINT32)"
                     );
      }
      lVar2 = lVar2 + 4;
      sa_line = y1;
    } while ((ulong)remaining_height << 2 != lVar2);
  }
  return;
}

Assistant:

static void opj_v4dwt_interleave_partial_h(opj_v4dwt_t* dwt,
        opj_sparse_array_int32_t* sa,
        OPJ_UINT32 sa_line,
        OPJ_UINT32 remaining_height)
{
    OPJ_UINT32 i;
    for (i = 0; i < remaining_height; i++) {
        OPJ_BOOL ret;
        ret = opj_sparse_array_int32_read(sa,
                                          dwt->win_l_x0, sa_line + i,
                                          dwt->win_l_x1, sa_line + i + 1,
                                          /* Nasty cast from float* to int32* */
                                          (OPJ_INT32*)(dwt->wavelet + dwt->cas + 2 * dwt->win_l_x0) + i,
                                          8, 0, OPJ_TRUE);
        assert(ret);
        ret = opj_sparse_array_int32_read(sa,
                                          (OPJ_UINT32)dwt->sn + dwt->win_h_x0, sa_line + i,
                                          (OPJ_UINT32)dwt->sn + dwt->win_h_x1, sa_line + i + 1,
                                          /* Nasty cast from float* to int32* */
                                          (OPJ_INT32*)(dwt->wavelet + 1 - dwt->cas + 2 * dwt->win_h_x0) + i,
                                          8, 0, OPJ_TRUE);
        assert(ret);
        OPJ_UNUSED(ret);
    }
}